

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.h
# Opt level: O0

void __thiscall
jaegertracing::agent::thrift::AgentProcessor::AgentProcessor
          (AgentProcessor *this,shared_ptr<jaegertracing::agent::thrift::AgentIf> *iface)

{
  mapped_type *pmVar1;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  key_type local_38;
  shared_ptr<jaegertracing::agent::thrift::AgentIf> *local_18;
  shared_ptr<jaegertracing::agent::thrift::AgentIf> *iface_local;
  AgentProcessor *this_local;
  
  local_18 = iface;
  iface_local = (shared_ptr<jaegertracing::agent::thrift::AgentIf> *)this;
  apache::thrift::TDispatchProcessor::TDispatchProcessor(&this->super_TDispatchProcessor);
  (this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor =
       (_func_int **)&PTR__AgentProcessor_00517660;
  std::shared_ptr<jaegertracing::agent::thrift::AgentIf>::shared_ptr(&this->iface_,iface);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
  ::map(&this->processMap_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"emitZipkinBatch",&local_39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
           ::operator[](&this->processMap_,&local_38);
  *pmVar1 = (mapped_type)process_emitZipkinBatch;
  pmVar1[1] = 0;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"emitBatch",&local_71);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
           ::operator[](&this->processMap_,&local_70);
  *pmVar1 = (mapped_type)process_emitBatch;
  pmVar1[1] = 0;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

AgentProcessor(::std::shared_ptr<AgentIf> iface) :
    iface_(iface) {
    processMap_["emitZipkinBatch"] = &AgentProcessor::process_emitZipkinBatch;
    processMap_["emitBatch"] = &AgentProcessor::process_emitBatch;
  }